

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handlePragmaDirective(Preprocessor *this,Token directive)

{
  Token token;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  Token TVar1;
  bool bVar2;
  int iVar4;
  undefined1 uVar3;
  undefined4 extraout_var;
  span<slang::parsing::Token,_18446744073709551615UL> *__s;
  Info *in_RCX;
  undefined8 in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Trivia *extraout_RDX_01;
  Preprocessor *in_RSI;
  Preprocessor *in_RDI;
  Trivia TVar5;
  Token TVar6;
  Token TVar7;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar8;
  Trivia skippedTrivia;
  PragmaDirectiveSyntax *result;
  type_conflict3 *succeeded;
  type *expr;
  bool ok;
  bool wantComma;
  Token name;
  SmallVector<slang::parsing::Token,_4UL> skipped;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> args;
  undefined7 in_stack_fffffffffffffcc8;
  TriviaKind in_stack_fffffffffffffccf;
  Preprocessor *in_stack_fffffffffffffcd0;
  Trivia *this_00;
  SourceLocation in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 uVar9;
  DiagCode in_stack_fffffffffffffce4;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffce8;
  Info *in_stack_fffffffffffffcf0;
  Token *in_stack_fffffffffffffd18;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd58;
  Preprocessor *this_01;
  byte local_281;
  Trivia local_280;
  span<slang::parsing::Token,_18446744073709551615UL> *local_270;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffffda0;
  PragmaDirectiveSyntax *in_stack_fffffffffffffda8;
  Preprocessor *in_stack_fffffffffffffdb0;
  Trivia local_240;
  undefined8 local_230;
  PragmaDirectiveSyntax *local_220;
  Token local_218;
  type_conflict3 *local_1f0;
  type *local_1e8;
  PragmaExpressionSyntax *local_1e0;
  undefined1 local_1d8;
  PragmaExpressionSyntax *local_1d0;
  undefined1 local_1c8;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *local_1c0;
  Info *local_1b8;
  byte local_196;
  byte local_195;
  Token local_188;
  SmallVectorBase<slang::parsing::Token> local_178 [2];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_120 [2];
  Trivia local_a8;
  Trivia local_98;
  Token local_88;
  anon_union_12_4_39e54f29_for_Trivia_0 local_70;
  undefined2 local_64;
  string_view local_60;
  SourceLocation local_50;
  SourceLocation local_48;
  undefined4 local_3c;
  Token local_38;
  Token local_28;
  Token local_10;
  undefined4 extraout_var_00;
  
  this_01 = in_RDI;
  local_10._0_8_ = in_RDX;
  local_10.info = in_RCX;
  local_28 = peek((Preprocessor *)in_stack_fffffffffffffcd8);
  local_281 = 1;
  if (local_28.kind == Identifier) {
    local_38 = peek((Preprocessor *)in_stack_fffffffffffffcd8);
    bVar2 = Token::isOnSameLine(in_stack_fffffffffffffd18);
    local_281 = bVar2 ^ 0xff;
  }
  if ((local_281 & 1) == 0) {
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x6226f8);
    SmallVector<slang::parsing::Token,_4UL>::SmallVector
              ((SmallVector<slang::parsing::Token,_4UL> *)0x622705);
    TVar6 = consume((Preprocessor *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_195 = 0;
    local_196 = 1;
    local_188 = TVar6;
    do {
      while( true ) {
        uVar3 = peekSameLine((Preprocessor *)
                             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
        TVar7.info = local_218.info;
        TVar7.kind = local_218.kind;
        TVar7._2_1_ = local_218._2_1_;
        TVar7.numFlags.raw = local_218.numFlags.raw;
        TVar7.rawLen = local_218.rawLen;
        src = extraout_RDX;
        if (!(bool)uVar3) goto LAB_0062296c;
        if ((local_195 & 1) == 0) break;
        TVar7 = expect(this_01,(TokenKind)((ulong)in_stack_fffffffffffffd58 >> 0x30));
        local_1b8 = TVar7.info;
        in_stack_fffffffffffffd38 = TVar7._0_8_;
        token.info._0_4_ = in_stack_fffffffffffffce0;
        token._0_8_ = in_stack_fffffffffffffcd8;
        token.info._4_4_ = in_stack_fffffffffffffce4;
        local_1c0 = in_stack_fffffffffffffd38;
        slang::syntax::TokenOrSyntax::TokenOrSyntax
                  ((TokenOrSyntax *)in_stack_fffffffffffffcd0,token);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffcd0,
                   (TokenOrSyntax *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
        local_195 = 0;
      }
      pVar8 = parsePragmaExpression(in_RSI);
      local_1e0 = pVar8.first;
      local_1d8 = pVar8.second;
      local_1d0 = local_1e0;
      local_1c8 = local_1d8;
      local_1e8 = std::get<0ul,slang::syntax::PragmaExpressionSyntax*,bool>
                            ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)0x622890);
      local_1f0 = std::get<1ul,slang::syntax::PragmaExpressionSyntax*,bool>
                            ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)0x6228a2);
      slang::syntax::TokenOrSyntax::TokenOrSyntax
                ((TokenOrSyntax *)in_stack_fffffffffffffcd0,
                 (SyntaxNode *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffcd0,
                 (TokenOrSyntax *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      TVar1.info = local_218.info;
      TVar1.kind = local_218.kind;
      TVar1._2_1_ = local_218._2_1_;
      TVar1.numFlags.raw = local_218.numFlags.raw;
      TVar1.rawLen = local_218.rawLen;
      local_195 = 1;
    } while ((*local_1f0 & 1U) != 0);
    while( true ) {
      local_218 = TVar1;
      bVar2 = peekSameLine((Preprocessor *)
                           CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      if (!bVar2) break;
      TVar7 = consume((Preprocessor *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
      ;
      local_218 = TVar7;
      SmallVectorBase<slang::parsing::Token>::push_back
                ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffcd0,
                 (Token *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      TVar1 = local_218;
    }
    local_196 = 0;
    src = extraout_RDX_00;
    TVar7 = local_218;
LAB_0062296c:
    local_218 = TVar7;
    iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (local_120,(EVP_PKEY_CTX *)in_RSI->alloc,src);
    local_230 = CONCAT44(extraout_var,iVar4);
    local_220 = BumpAllocator::
                emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                          (TVar6._0_8_,(Token *)TVar6.info,
                           (Token *)CONCAT17(uVar3,in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd38);
    uVar9 = SUB84(local_220,0);
    uVar10 = (undefined4)((ulong)local_220 >> 0x20);
    if ((local_196 & 1) != 0) {
      applyPragma(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    }
    Trivia::Trivia(&local_240);
    bVar2 = SmallVectorBase<slang::parsing::Token>::empty(local_178);
    if (!bVar2) {
      iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                        (local_178,(EVP_PKEY_CTX *)in_RSI->alloc,src_00);
      __s = (span<slang::parsing::Token,_18446744073709551615UL> *)CONCAT44(extraout_var_00,iVar4);
      this_00 = extraout_RDX_01;
      local_270 = __s;
      std::span<const_slang::parsing::Token,_18446744073709551615UL>::
      span<slang::parsing::Token,_18446744073709551615UL>
                ((span<const_slang::parsing::Token,_18446744073709551615UL> *)CONCAT44(uVar10,uVar9)
                 ,__s);
      tokens._M_extent._M_extent_value._0_4_ = uVar9;
      tokens._M_ptr = (pointer)__s;
      tokens._M_extent._M_extent_value._4_4_ = uVar10;
      Trivia::Trivia(this_00,in_stack_fffffffffffffccf,tokens);
    }
    Trivia::Trivia(&local_280,Directive,(SyntaxNode *)local_220);
    std::pair<slang::parsing::Trivia,_slang::parsing::Trivia>::
    pair<slang::parsing::Trivia,_slang::parsing::Trivia_&,_true>
              ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)this_01,&local_280,&local_240
              );
    SmallVector<slang::parsing::Token,_4UL>::~SmallVector
              ((SmallVector<slang::parsing::Token,_4UL> *)0x622b23);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x622b30);
  }
  else {
    local_3c = 0x90004;
    local_50 = Token::location(&local_10);
    local_60 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                             );
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_60);
    local_48 = SourceLocation::operator+<unsigned_long>
                         ((SourceLocation *)in_stack_fffffffffffffcd8,
                          (unsigned_long)in_stack_fffffffffffffcd0);
    addDiag(in_stack_fffffffffffffcd0,in_stack_fffffffffffffce4,in_stack_fffffffffffffcd8);
    local_88.kind = local_10.kind;
    local_88._2_1_ = local_10._2_1_;
    local_88.numFlags.raw = local_10.numFlags.raw;
    local_88.rawLen = local_10.rawLen;
    local_88.info = local_10.info;
    TVar6.info = in_stack_fffffffffffffcf0;
    TVar6.kind = (short)in_stack_fffffffffffffce8;
    TVar6._2_1_ = (char)((ulong)in_stack_fffffffffffffce8 >> 0x10);
    TVar6.numFlags.raw = (char)((ulong)in_stack_fffffffffffffce8 >> 0x18);
    TVar6.rawLen = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
    TVar5 = createSimpleDirective
                      ((Preprocessor *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                       ,TVar6);
    local_98.field_0._0_8_ = TVar5.field_0._0_8_;
    local_70.syntaxNode = local_98.field_0.syntaxNode;
    local_98.field_0._8_4_ = TVar5.field_0._8_4_;
    local_70.rawText.len = local_98.field_0._8_4_;
    local_98._12_2_ = TVar5._12_2_;
    local_64._0_1_ = local_98.hasFullLocation;
    local_64._1_1_ = local_98.kind;
    local_98 = TVar5;
    Trivia::Trivia(&local_a8);
    std::pair<slang::parsing::Trivia,_slang::parsing::Trivia>::
    pair<slang::parsing::Trivia,_slang::parsing::Trivia,_true>
              ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)this_01,
               (Trivia *)&local_70.rawText,&local_a8);
  }
  return (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)in_RDI;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handlePragmaDirective(Token directive) {
    if (peek().kind != TokenKind::Identifier || !peek().isOnSameLine()) {
        addDiag(diag::ExpectedPragmaName, directive.location() + directive.rawText().length());
        return {createSimpleDirective(directive), Trivia()};
    }

    SmallVector<TokenOrSyntax, 4> args;
    SmallVector<Token, 4> skipped;
    Token name = consume();
    bool wantComma = false;
    bool ok = true;

    // This loop needs to be careful not to prematurely peek() and pull a
    // new token from the lexer, since some pragmas may change how we lex
    // tokens on the following line (such as pragma protect encoded blocks).
    while (peekSameLine()) {
        if (wantComma) {
            args.push_back(expect(TokenKind::Comma));
            wantComma = false;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            args.push_back(expr);
            wantComma = true;

            if (!succeeded) {
                while (peekSameLine())
                    skipped.push_back(consume());

                ok = false;
                break;
            }
        }
    }

    auto result = alloc.emplace<PragmaDirectiveSyntax>(directive, name, args.copy(alloc));
    if (ok)
        applyPragma(*result, skipped);

    Trivia skippedTrivia;
    if (!skipped.empty())
        skippedTrivia = Trivia(TriviaKind::SkippedTokens, skipped.copy(alloc));

    return {Trivia(TriviaKind::Directive, result), skippedTrivia};
}